

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

int tree_print_config(lyout *out,lys_node *node,int spec_config)

{
  LYS_NODE LVar1;
  int iVar2;
  char *local_40;
  int local_28;
  int ret;
  int spec_config_local;
  lys_node *node_local;
  lyout *out_local;
  
  LVar1 = node->nodetype;
  if (LVar1 == LYS_CASE) {
    out_local._4_4_ = ly_print(out,":(");
  }
  else if (LVar1 == LYS_NOTIF) {
    out_local._4_4_ = ly_print(out,"-n ");
  }
  else {
    if (LVar1 != LYS_RPC) {
      if (LVar1 == LYS_USES) {
        iVar2 = ly_print(out,"-u ");
        return iVar2;
      }
      if (LVar1 != LYS_ACTION) {
        if (spec_config == 1) {
          local_28 = ly_print(out,"-w ");
        }
        else if (spec_config == 2) {
          local_28 = ly_print(out,"ro ");
        }
        else {
          if ((node->flags & 1) == 0) {
            local_40 = "--";
            if ((node->flags & 2) != 0) {
              local_40 = "ro";
            }
          }
          else {
            local_40 = "rw";
          }
          local_28 = ly_print(out,"%s ",local_40);
        }
        if (node->nodetype == LYS_CHOICE) {
          iVar2 = ly_print(out,"(");
          local_28 = iVar2 + local_28;
        }
        return local_28;
      }
    }
    out_local._4_4_ = ly_print(out,"-x ");
  }
  return out_local._4_4_;
}

Assistant:

static int
tree_print_config(struct lyout *out, const struct lys_node *node, int spec_config)
{
    int ret;

    switch (node->nodetype) {
    case LYS_RPC:
    case LYS_ACTION:
        return ly_print(out, "-x ");
    case LYS_NOTIF:
        return ly_print(out, "-n ");
    case LYS_USES:
        return ly_print(out, "-u ");
    case LYS_CASE:
        return ly_print(out, ":(");
    default:
        break;
    }

    if (spec_config == 1) {
        ret = ly_print(out, "-w ");
    } else if (spec_config == 2) {
        ret = ly_print(out, "ro ");
    } else {
        ret = ly_print(out, "%s ", (node->flags & LYS_CONFIG_W) ? "rw" : (node->flags & LYS_CONFIG_R) ? "ro" : "--");
    }

    if (node->nodetype == LYS_CHOICE) {
        ret += ly_print(out, "(");
    }
    return ret;
}